

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O3

bool __thiscall HMatrix::setup_ok(HMatrix *this,int *nonbasicFlag_)

{
  uint *puVar1;
  pointer piVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  char *__format;
  int *piVar8;
  bool bVar9;
  
  puts("Checking row-wise matrix");
  uVar7 = (ulong)this->numRow;
  if (0 < (long)uVar7) {
    puVar1 = (uint *)(this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    piVar2 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = *puVar1;
    uVar4 = 0;
    bVar9 = false;
    do {
      uVar3 = (this->AR_Nend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      if ((int)uVar5 < (int)uVar3) {
        piVar8 = piVar2 + (int)uVar5;
        do {
          lVar6 = (long)*piVar8;
          if (nonbasicFlag_[lVar6] == 0) {
            __format = "Row-wise matrix error: col %d, (el = %d for row %d) is basic\n";
            goto LAB_00126dab;
          }
          uVar5 = uVar5 + 1;
          piVar8 = piVar8 + 1;
        } while (uVar3 != uVar5);
      }
      uVar5 = puVar1[uVar4 + 1];
      if ((int)uVar3 < (int)uVar5) {
        piVar8 = piVar2 + (int)uVar3;
        do {
          lVar6 = (long)*piVar8;
          if (nonbasicFlag_[lVar6] != 0) {
            __format = "Row-wise matrix error: col %d, (el = %d for row %d) is nonbasic\n";
            uVar5 = uVar3;
LAB_00126dab:
            printf(__format,lVar6,(ulong)uVar5);
            return bVar9;
          }
          uVar3 = uVar3 + 1;
          piVar8 = piVar8 + 1;
        } while (uVar5 != uVar3);
      }
      uVar4 = uVar4 + 1;
      bVar9 = uVar7 <= uVar4;
    } while (uVar4 != uVar7);
  }
  return true;
}

Assistant:

bool HMatrix::setup_ok(const int *nonbasicFlag_) {
  printf("Checking row-wise matrix\n");
  for (int row = 0; row < numRow; row++) {
    for (int el = ARstart[row]; el < AR_Nend[row]; el++) {
      int col = ARindex[el];
      if (!nonbasicFlag_[col]) {
	printf("Row-wise matrix error: col %d, (el = %d for row %d) is basic\n", col, el, row);
	return false;
      }
    }
    for (int el = AR_Nend[row]; el < ARstart[row+1]; el++) {
      int col = ARindex[el];
      if (nonbasicFlag_[col]) {
	printf("Row-wise matrix error: col %d, (el = %d for row %d) is nonbasic\n", col, el, row);
	return false;
      }
    }
  }
  return true;
}